

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLock::ConstraintsBiReset(ChLinkLock *this)

{
  pointer ppCVar1;
  ChLinkLimit *pCVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(this->mask).super_ChLinkMask.nconstr;
  if (0 < lVar3) {
    ppCVar1 = (this->mask).super_ChLinkMask.constraints.
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      if ((this->mask).super_ChLinkMask.nconstr <= lVar4) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      (ppCVar1[lVar4]->super_ChConstraintTwo).super_ChConstraint.b_i = 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  pCVar2 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar2 != (ChLinkLimit *)0x0) && (pCVar2->m_active == true)) {
    if (*(bool *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar2 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar2 != (ChLinkLimit *)0x0) && (pCVar2->m_active == true)) {
    if (*(bool *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar2 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar2 != (ChLinkLimit *)0x0) && (pCVar2->m_active == true)) {
    if (*(bool *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar2 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar2 != (ChLinkLimit *)0x0) && (pCVar2->m_active == true)) {
    if (*(bool *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar2 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar2 != (ChLinkLimit *)0x0) && (pCVar2->m_active == true)) {
    if (*(bool *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar2 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar2 != (ChLinkLimit *)0x0) && (pCVar2->m_active == true)) {
    if (*(bool *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar2->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  return;
}

Assistant:

void ChLinkLock::ConstraintsBiReset() {
    for (int i = 0; i < mask.nconstr; i++) {
        mask.Constr_N(i).Set_b_i(0.);
    }

    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            limit_X->constr_lower.Set_b_i(0.);
        }
        if (limit_X->constr_upper.IsActive()) {
            limit_X->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            limit_Y->constr_lower.Set_b_i(0.);
        }
        if (limit_Y->constr_upper.IsActive()) {
            limit_Y->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            limit_Z->constr_lower.Set_b_i(0.);
        }
        if (limit_Z->constr_upper.IsActive()) {
            limit_Z->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            limit_Rx->constr_lower.Set_b_i(0.);
        }
        if (limit_Rx->constr_upper.IsActive()) {
            limit_Rx->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            limit_Ry->constr_lower.Set_b_i(0.);
        }
        if (limit_Ry->constr_upper.IsActive()) {
            limit_Ry->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            limit_Rz->constr_lower.Set_b_i(0.);
        }
        if (limit_Rz->constr_upper.IsActive()) {
            limit_Rz->constr_upper.Set_b_i(0.);
        }
    }
}